

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O0

int ndiffs(double *x,int N,double *alpha,char *test,char *type,int *max_d)

{
  int iVar1;
  double *sig;
  double *oup;
  int local_7c;
  double *local_78;
  double *z;
  double *y;
  double alpha_;
  int local_50;
  int dodiff;
  int NX;
  int cc;
  int max_d_;
  int d;
  int *max_d_local;
  char *type_local;
  char *test_local;
  double *alpha_local;
  int N_local;
  double *x_local;
  
  cc = 0;
  if (alpha == (double *)0x0) {
    local_78 = (double *)0x3fa999999999999a;
  }
  else {
    local_78 = (double *)*alpha;
  }
  y = local_78;
  if (max_d == (int *)0x0) {
    local_7c = 2;
  }
  else {
    local_7c = *max_d;
  }
  if (local_7c < 0) {
    printf("Error. Maximum Difference cannot be less than 0 \n");
    exit(-1);
  }
  if ((double)local_78 < 0.01) {
    y = (double *)0x3f847ae147ae147b;
    printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. \n");
  }
  if (0.1 < (double)y) {
    y = (double *)0x3fb999999999999a;
    printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. \n");
  }
  iVar1 = checkConstant(x,N);
  if (iVar1 == 1) {
    x_local._4_4_ = 0;
  }
  else {
    alpha_._4_4_ = runstattests(x,N,test,type,(double)y);
    sig = (double *)malloc((long)N << 3);
    oup = (double *)malloc((long)N << 3);
    memcpy(sig,x,(long)N << 3);
    local_50 = N;
    while (alpha_._4_4_ != 0 && cc < local_7c) {
      cc = cc + 1;
      local_50 = diff(sig,local_50,1,oup);
      iVar1 = checkConstant(oup,local_50);
      if (iVar1 == 1) break;
      alpha_._4_4_ = runstattests(oup,local_50,test,type,(double)y);
      memcpy(sig,oup,(long)local_50 << 3);
    }
    free(sig);
    free(oup);
    x_local._4_4_ = cc;
  }
  return x_local._4_4_;
}

Assistant:

int ndiffs(double *x, int N,double *alpha, const char *test,const char *type, int *max_d) {
    int d,max_d_,cc,NX,dodiff;
    double alpha_;
    double *y,*z;

    d = 0;

    alpha_ = alpha == NULL ? 0.05 : *alpha;
    max_d_ = max_d == NULL ? 2 : *max_d;

    // printf("%g \n",alpha_);

    if (max_d_ < 0) {
        printf("Error. Maximum Difference cannot be less than 0 \n");
        exit(-1);
    } 

    if (alpha_ < 0.01) {
        alpha_ = 0.01;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.01. \n");
    }

    if (alpha_ > 0.1) {
        alpha_ = 0.1;
        printf("Warning : Alpha only takes values from 0.01 o 0.1. Setting alpha to 0.1. \n");
    }

    cc = checkConstant(x,N);

    if (cc == 1) return d;

    NX = N;

    dodiff = runstattests(x,N,test,type,alpha_);


    if (dodiff != dodiff) return d;

    y = (double*)malloc(sizeof(double)*NX);
    z = (double*)malloc(sizeof(double)*NX);

    memcpy(y,x,sizeof(double)*NX);

    while (dodiff && d < max_d_) {

        d++;
        //printf("d %d \n",d);

        NX = diff(y,NX,1,z);

        cc = checkConstant(z,NX);

        //printf("cc %d \n",cc);

        if (cc == 1) break;

        dodiff = runstattests(z,NX,test,type,alpha_);

        //printf("dodiff %d \n",dodiff);

        if (dodiff != dodiff) {
            d--;
            break;
        }

        memcpy(y,z,sizeof(double)*NX);
    }

    free(y);
    free(z);

    return d;
}